

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O0

void add_array_member_fn(File *file,CopyFuncType copy,char *format,uint data,int last)

{
  int last_local;
  uint data_local;
  char *format_local;
  CopyFuncType copy_local;
  File *file_local;
  
  if (file->binary == 0) {
    myfprintf(file->fp,format,(ulong)data);
    if (last == 0) {
      myfprintf(file->fp,", ");
    }
  }
  else {
    add_array_member_internal(file);
    (*copy)((file->tables).cur,data);
    (file->tables).cur = (file->tables).cur + file->elem_size;
  }
  return;
}

Assistant:

static void add_array_member_fn(File *file, CopyFuncType copy, char *format, uint data, int last) {
  if (file->binary) {
    add_array_member_internal(file);
    copy((void *)(file->tables.cur), data);
    file->tables.cur += file->elem_size;
  } else {
    fprintf((file)->fp, format, data);
    if (!last) fprintf(file->fp, ", ");
  }
}